

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O1

_Bool gen_arith(TCGContext_conflict11 *tcg_ctx,arg_r_conflict *a,
               _func_void_TCGContext_ptr_TCGv_i64_TCGv_i64_TCGv_i64_conflict11 *func)

{
  undefined1 extraout_AL;
  TCGTemp *a1;
  TCGTemp *a1_00;
  uintptr_t o;
  TCGv_i64 pTVar1;
  TCGv_i64 a2;
  uintptr_t o_4;
  TCGOpcode TVar2;
  uintptr_t o_3;
  TCGv_i64 pTVar3;
  
  a1 = tcg_temp_new_internal_riscv64(tcg_ctx,TCG_TYPE_I64,false);
  pTVar3 = (TCGv_i64)((long)a1 - (long)tcg_ctx);
  a1_00 = tcg_temp_new_internal_riscv64(tcg_ctx,TCG_TYPE_I64,false);
  if ((long)a->rs1 == 0) {
    TVar2 = INDEX_op_movi_i64;
    pTVar1 = (TCGv_i64)0x0;
LAB_00c7a5eb:
    tcg_gen_op2_riscv64(tcg_ctx,TVar2,(TCGArg)a1,(TCGArg)pTVar1);
  }
  else if (tcg_ctx->cpu_gpr[a->rs1] != pTVar3) {
    pTVar1 = tcg_ctx->cpu_gpr[a->rs1] + (long)tcg_ctx;
    TVar2 = INDEX_op_mov_i64;
    goto LAB_00c7a5eb;
  }
  pTVar1 = (TCGv_i64)((long)a1_00 - (long)tcg_ctx);
  if ((long)a->rs2 == 0) {
    TVar2 = INDEX_op_movi_i64;
    a2 = (TCGv_i64)0x0;
  }
  else {
    if (tcg_ctx->cpu_gpr[a->rs2] == pTVar1) goto LAB_00c7a62f;
    a2 = tcg_ctx->cpu_gpr[a->rs2] + (long)tcg_ctx;
    TVar2 = INDEX_op_mov_i64;
  }
  tcg_gen_op2_riscv64(tcg_ctx,TVar2,(TCGArg)a1_00,(TCGArg)a2);
LAB_00c7a62f:
  (*func)(tcg_ctx,pTVar3,pTVar3,pTVar1);
  if (((long)a->rd != 0) && (tcg_ctx->cpu_gpr[a->rd] != pTVar3)) {
    tcg_gen_op2_riscv64(tcg_ctx,INDEX_op_mov_i64,(TCGArg)(tcg_ctx->cpu_gpr[a->rd] + (long)tcg_ctx),
                        (TCGArg)a1);
  }
  tcg_temp_free_internal_riscv64(tcg_ctx,(TCGTemp *)(pTVar3 + (long)tcg_ctx));
  tcg_temp_free_internal_riscv64(tcg_ctx,(TCGTemp *)(pTVar1 + (long)tcg_ctx));
  return (_Bool)extraout_AL;
}

Assistant:

static void gen_arith(DisasContext *ctx, uint32_t opc,
                      int rd, int rs, int rt)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    if (rd == 0 && opc != OPC_ADD && opc != OPC_SUB
       && opc != OPC_DADD && opc != OPC_DSUB) {
        /*
         * If no destination, treat it as a NOP.
         * For add & sub, we must generate the overflow exception when needed.
         */
        return;
    }

    switch (opc) {
    case OPC_ADD:
        {
            TCGv t0 = tcg_temp_local_new(tcg_ctx);
            TCGv t1 = tcg_temp_new(tcg_ctx);
            TCGv t2 = tcg_temp_new(tcg_ctx);
            TCGLabel *l1 = gen_new_label(tcg_ctx);

            gen_load_gpr(tcg_ctx, t1, rs);
            gen_load_gpr(tcg_ctx, t2, rt);
            tcg_gen_add_tl(tcg_ctx, t0, t1, t2);
            tcg_gen_ext32s_tl(tcg_ctx, t0, t0);
            tcg_gen_xor_tl(tcg_ctx, t1, t1, t2);
            tcg_gen_xor_tl(tcg_ctx, t2, t0, t2);
            tcg_gen_andc_tl(tcg_ctx, t1, t2, t1);
            tcg_temp_free(tcg_ctx, t2);
            tcg_gen_brcondi_tl(tcg_ctx, TCG_COND_GE, t1, 0, l1);
            tcg_temp_free(tcg_ctx, t1);
            /* operands of same sign, result different sign */
            generate_exception(ctx, EXCP_OVERFLOW);
            gen_set_label(tcg_ctx, l1);
            gen_store_gpr(tcg_ctx, t0, rd);
            tcg_temp_free(tcg_ctx, t0);
        }
        break;
    case OPC_ADDU:
        if (rs != 0 && rt != 0) {
            tcg_gen_add_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], tcg_ctx->cpu_gpr[rs], tcg_ctx->cpu_gpr[rt]);
            tcg_gen_ext32s_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], tcg_ctx->cpu_gpr[rd]);
        } else if (rs == 0 && rt != 0) {
            tcg_gen_mov_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], tcg_ctx->cpu_gpr[rt]);
        } else if (rs != 0 && rt == 0) {
            tcg_gen_mov_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], tcg_ctx->cpu_gpr[rs]);
        } else {
            tcg_gen_movi_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], 0);
        }
        break;
    case OPC_SUB:
        {
            TCGv t0 = tcg_temp_local_new(tcg_ctx);
            TCGv t1 = tcg_temp_new(tcg_ctx);
            TCGv t2 = tcg_temp_new(tcg_ctx);
            TCGLabel *l1 = gen_new_label(tcg_ctx);

            gen_load_gpr(tcg_ctx, t1, rs);
            gen_load_gpr(tcg_ctx, t2, rt);
            tcg_gen_sub_tl(tcg_ctx, t0, t1, t2);
            tcg_gen_ext32s_tl(tcg_ctx, t0, t0);
            tcg_gen_xor_tl(tcg_ctx, t2, t1, t2);
            tcg_gen_xor_tl(tcg_ctx, t1, t0, t1);
            tcg_gen_and_tl(tcg_ctx, t1, t1, t2);
            tcg_temp_free(tcg_ctx, t2);
            tcg_gen_brcondi_tl(tcg_ctx, TCG_COND_GE, t1, 0, l1);
            tcg_temp_free(tcg_ctx, t1);
            /*
             * operands of different sign, first operand and the result
             * of different sign
             */
            generate_exception(ctx, EXCP_OVERFLOW);
            gen_set_label(tcg_ctx, l1);
            gen_store_gpr(tcg_ctx, t0, rd);
            tcg_temp_free(tcg_ctx, t0);
        }
        break;
    case OPC_SUBU:
        if (rs != 0 && rt != 0) {
            tcg_gen_sub_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], tcg_ctx->cpu_gpr[rs], tcg_ctx->cpu_gpr[rt]);
            tcg_gen_ext32s_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], tcg_ctx->cpu_gpr[rd]);
        } else if (rs == 0 && rt != 0) {
            tcg_gen_neg_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], tcg_ctx->cpu_gpr[rt]);
            tcg_gen_ext32s_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], tcg_ctx->cpu_gpr[rd]);
        } else if (rs != 0 && rt == 0) {
            tcg_gen_mov_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], tcg_ctx->cpu_gpr[rs]);
        } else {
            tcg_gen_movi_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], 0);
        }
        break;
#if defined(TARGET_MIPS64)
    case OPC_DADD:
        {
            TCGv t0 = tcg_temp_local_new(tcg_ctx);
            TCGv t1 = tcg_temp_new(tcg_ctx);
            TCGv t2 = tcg_temp_new(tcg_ctx);
            TCGLabel *l1 = gen_new_label(tcg_ctx);

            gen_load_gpr(tcg_ctx, t1, rs);
            gen_load_gpr(tcg_ctx, t2, rt);
            tcg_gen_add_tl(tcg_ctx, t0, t1, t2);
            tcg_gen_xor_tl(tcg_ctx, t1, t1, t2);
            tcg_gen_xor_tl(tcg_ctx, t2, t0, t2);
            tcg_gen_andc_tl(tcg_ctx, t1, t2, t1);
            tcg_temp_free(tcg_ctx, t2);
            tcg_gen_brcondi_tl(tcg_ctx, TCG_COND_GE, t1, 0, l1);
            tcg_temp_free(tcg_ctx, t1);
            /* operands of same sign, result different sign */
            generate_exception(ctx, EXCP_OVERFLOW);
            gen_set_label(tcg_ctx, l1);
            gen_store_gpr(tcg_ctx, t0, rd);
            tcg_temp_free(tcg_ctx, t0);
        }
        break;
    case OPC_DADDU:
        if (rs != 0 && rt != 0) {
            tcg_gen_add_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], tcg_ctx->cpu_gpr[rs], tcg_ctx->cpu_gpr[rt]);
        } else if (rs == 0 && rt != 0) {
            tcg_gen_mov_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], tcg_ctx->cpu_gpr[rt]);
        } else if (rs != 0 && rt == 0) {
            tcg_gen_mov_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], tcg_ctx->cpu_gpr[rs]);
        } else {
            tcg_gen_movi_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], 0);
        }
        break;
    case OPC_DSUB:
        {
            TCGv t0 = tcg_temp_local_new(tcg_ctx);
            TCGv t1 = tcg_temp_new(tcg_ctx);
            TCGv t2 = tcg_temp_new(tcg_ctx);
            TCGLabel *l1 = gen_new_label(tcg_ctx);

            gen_load_gpr(tcg_ctx, t1, rs);
            gen_load_gpr(tcg_ctx, t2, rt);
            tcg_gen_sub_tl(tcg_ctx, t0, t1, t2);
            tcg_gen_xor_tl(tcg_ctx, t2, t1, t2);
            tcg_gen_xor_tl(tcg_ctx, t1, t0, t1);
            tcg_gen_and_tl(tcg_ctx, t1, t1, t2);
            tcg_temp_free(tcg_ctx, t2);
            tcg_gen_brcondi_tl(tcg_ctx, TCG_COND_GE, t1, 0, l1);
            tcg_temp_free(tcg_ctx, t1);
            /*
             * Operands of different sign, first operand and result different
             * sign.
             */
            generate_exception(ctx, EXCP_OVERFLOW);
            gen_set_label(tcg_ctx, l1);
            gen_store_gpr(tcg_ctx, t0, rd);
            tcg_temp_free(tcg_ctx, t0);
        }
        break;
    case OPC_DSUBU:
        if (rs != 0 && rt != 0) {
            tcg_gen_sub_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], tcg_ctx->cpu_gpr[rs], tcg_ctx->cpu_gpr[rt]);
        } else if (rs == 0 && rt != 0) {
            tcg_gen_neg_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], tcg_ctx->cpu_gpr[rt]);
        } else if (rs != 0 && rt == 0) {
            tcg_gen_mov_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], tcg_ctx->cpu_gpr[rs]);
        } else {
            tcg_gen_movi_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], 0);
        }
        break;
#endif
    case OPC_MUL:
        if (likely(rs != 0 && rt != 0)) {
            tcg_gen_mul_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], tcg_ctx->cpu_gpr[rs], tcg_ctx->cpu_gpr[rt]);
            tcg_gen_ext32s_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], tcg_ctx->cpu_gpr[rd]);
        } else {
            tcg_gen_movi_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], 0);
        }
        break;
    }
}